

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O0

void jsoncons::
     encode_traits<std::tuple<std::__cxx11::string,jsoncons::basic_byte_string<std::allocator<unsigned_char>>,std::__cxx11::string>,char,void>
     ::encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (value_type *val,basic_json_visitor<char> *encoder,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *proto,
               error_code *ec)

{
  bool bVar1;
  error_code *in_RCX;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  error_code *in_stack_ffffffffffffff98;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_json_visitor<char> *in_stack_ffffffffffffffa8;
  ser_context local_40 [3];
  ser_context local_28;
  error_code *local_20;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_28._vptr_ser_context = (_func_int **)0x0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  ser_context::ser_context(&local_28);
  basic_json_visitor<char>::begin_array
            ((basic_json_visitor<char> *)in_RSI,(size_t)in_stack_ffffffffffffffa8,
             (semantic_tag)((ulong)in_stack_ffffffffffffffa0 >> 0x38),
             (ser_context *)in_stack_ffffffffffffff98,(error_code *)0x324785);
  ser_context::~ser_context(&local_28);
  bVar1 = std::error_code::operator_cast_to_bool(local_20);
  if (!bVar1) {
    detail::
    json_serialize_tuple_helper<3UL,_3UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::encode(in_RSI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    bVar1 = std::error_code::operator_cast_to_bool(local_20);
    if (!bVar1) {
      local_40[0]._vptr_ser_context = (_func_int **)0x0;
      ser_context::ser_context(local_40);
      basic_json_visitor<char>::end_array
                ((basic_json_visitor<char> *)local_10,(ser_context *)in_stack_ffffffffffffff98,
                 (error_code *)0x32482c);
      ser_context::~ser_context(local_40);
    }
  }
  return;
}

Assistant:

static void encode(const value_type& val, 
                           basic_json_visitor<CharT>& encoder, 
                           const Json& proto, 
                           std::error_code& ec)
        {
            using helper = jsoncons::detail::json_serialize_tuple_helper<size, size, Json, std::tuple<E...>>;
            encoder.begin_array(size,semantic_tag::none,ser_context(),ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            helper::encode(val, encoder, proto, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            encoder.end_array(ser_context(),ec);
        }